

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

int __thiscall
Centaurus::Grammar<wchar_t>::verify
          (Grammar<wchar_t> *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  wostream *pwVar2;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined7 uVar3;
  CompositeATN<wchar_t> local_80;
  reference local_38;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
  *__range2;
  Grammar<wchar_t> *this_local;
  
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
           ::begin(&this->m_networks);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
      ::end(&this->m_networks);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                         *)&p);
    if (!bVar1) {
      CompositeATN<wchar_t>::CompositeATN(&local_80,this);
      bVar1 = CompositeATN<wchar_t>::verify_decisions(&local_80,&this->m_networks);
      CompositeATN<wchar_t>::~CompositeATN(&local_80);
      uVar3 = (undefined7)((ulong)extraout_RAX >> 8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
LAB_001c7669:
      return (int)CONCAT71(uVar3,this_local._7_1_);
    }
    local_38 = std::__detail::
               _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_false,_true>
               ::operator*(&__end0);
    bVar1 = ATNMachine<wchar_t>::verify_invocations(&local_38->second,&this->m_networks);
    if (!bVar1) {
      pwVar2 = std::operator<<((wostream *)&std::wcerr,L"Nonterminal invocation check failed at ");
      pwVar2 = Centaurus::operator<<(pwVar2,&local_38->first);
      std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
      this_local._7_1_ = 0;
      uVar3 = extraout_var;
      goto LAB_001c7669;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_false,_true>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

bool Grammar<TCHAR>::verify() const
{
    for (const auto& p : m_networks)
    {
        if (!p.second.verify_invocations(m_networks))
        {
            std::wcerr << L"Nonterminal invocation check failed at " << p.first << std::endl;
            return false;
        }
    }

    if (!CompositeATN<TCHAR>(*this).verify_decisions(m_networks))
    {
        return false;
    }

    return true;
}